

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qresource.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_454c1b::QDynamicBufferResourceRoot::~QDynamicBufferResourceRoot
          (QDynamicBufferResourceRoot *this)

{
  Data *pDVar1;
  
  (this->super_QResourceRoot)._vptr_QResourceRoot =
       (_func_int **)&PTR__QDynamicBufferResourceRoot_006a8720;
  pDVar1 = (this->root).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->root).d.d)->super_QArrayData,2,0x10);
    }
  }
  operator_delete(this,0x48);
  return;
}

Assistant:

inline ~QDynamicBufferResourceRoot() { }